

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O0

void __thiscall DataRefs::dataRefDefinitionT::setData(dataRefDefinitionT *this,string *s)

{
  LTError *this_00;
  long in_RDI;
  invalid_argument *e;
  out_of_range *e_1;
  size_t *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff8c;
  dataRefDefinitionT *in_stack_ffffffffffffff90;
  
  if (*(int *)(in_RDI + 0x20) == 1) {
    std::__cxx11::stoi(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
    setData(in_stack_ffffffffffffff90,(int)in_stack_ffffffffffffff8c);
  }
  else {
    if (*(int *)(in_RDI + 0x20) != 2) {
      this_00 = (LTError *)__cxa_allocate_exception(0x18);
      LTError::LTError(this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp"
                       ,0x7cc,"setData",logFATAL,"ASSERT FAILED: %s","NULL");
      __cxa_throw(this_00,&LTError::typeinfo,LTError::~LTError);
    }
    std::__cxx11::stof(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    setData(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  }
  return;
}

Assistant:

void DataRefs::dataRefDefinitionT::setData (const std::string& s)
{
    try {
        switch (dataType) {
            case xplmType_Int:
                setData (std::stoi(s));
                break;
            case xplmType_Float:
                setData (std::stof(s));
                break;
            default:
                // else: must not happen
                LOG_ASSERT(NULL);
        }
    }
    catch (const std::invalid_argument& e) {
        LOG_MSG(logWARN,ERR_CFG_FILE_VALUE,dataName.c_str(),s.c_str(),e.what());
    }
    catch (const std::out_of_range& e) {
        LOG_MSG(logWARN,ERR_CFG_FILE_VALUE,dataName.c_str(),s.c_str(),e.what());
    }
}